

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftglyph.c
# Opt level: O3

FT_Error ft_svg_glyph_copy(FT_Glyph svg_source,FT_Glyph svg_target)

{
  FT_Glyph_Class *size;
  FT_Memory memory;
  FT_Pos FVar1;
  FT_Glyph_Class *pFVar2;
  FT_Pos FVar3;
  FT_Glyph_Format FVar4;
  undefined4 uVar5;
  FT_Error FVar6;
  FT_Library pFVar7;
  FT_Error error;
  FT_Error local_1c;
  
  local_1c = 0;
  FVar6 = 0x12;
  if (svg_source->format == FT_GLYPH_FORMAT_SVG) {
    size = svg_source[1].clazz;
    if (size == (FT_Glyph_Class *)0x0) {
      FVar6 = 0x25;
    }
    else {
      memory = svg_source->library->memory;
      svg_target[1].format = svg_source[1].format;
      svg_target[1].clazz = size;
      FVar1 = svg_source[1].advance.y;
      pFVar7 = svg_source[2].library;
      pFVar2 = svg_source[2].clazz;
      FVar4 = svg_source[2].format;
      uVar5 = *(undefined4 *)&svg_source[2].field_0x14;
      FVar3 = svg_source[2].advance.x;
      svg_target[1].advance.x = svg_source[1].advance.x;
      svg_target[1].advance.y = FVar1;
      svg_target[2].library = pFVar7;
      svg_target[2].clazz = pFVar2;
      svg_target[2].format = FVar4;
      *(undefined4 *)&svg_target[2].field_0x14 = uVar5;
      svg_target[2].advance.x = FVar3;
      svg_target[2].advance.y = svg_source[2].advance.y;
      *(undefined4 *)&svg_target[3].library = *(undefined4 *)&svg_source[3].library;
      *(undefined2 *)((long)&svg_target[3].library + 4) =
           *(undefined2 *)((long)&svg_source[3].library + 4);
      FVar4 = svg_source[3].format;
      uVar5 = *(undefined4 *)&svg_source[3].field_0x14;
      FVar1 = svg_source[3].advance.x;
      FVar3 = svg_source[3].advance.y;
      svg_target[3].clazz = svg_source[3].clazz;
      svg_target[3].format = FVar4;
      *(undefined4 *)&svg_target[3].field_0x14 = uVar5;
      svg_target[3].advance.x = FVar1;
      svg_target[3].advance.y = FVar3;
      pFVar2 = svg_source[4].clazz;
      svg_target[4].library = svg_source[4].library;
      svg_target[4].clazz = pFVar2;
      pFVar7 = (FT_Library)ft_mem_qalloc(memory,(FT_Long)size,&local_1c);
      svg_target[1].library = pFVar7;
      FVar6 = local_1c;
      if (local_1c == 0) {
        memcpy(pFVar7,svg_source[1].library,(size_t)svg_target[1].clazz);
        FVar6 = local_1c;
      }
    }
  }
  return FVar6;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  ft_svg_glyph_copy( FT_Glyph  svg_source,
                     FT_Glyph  svg_target )
  {
    FT_SvgGlyph  source = (FT_SvgGlyph)svg_source;
    FT_SvgGlyph  target = (FT_SvgGlyph)svg_target;

    FT_Error   error  = FT_Err_Ok;
    FT_Memory  memory = FT_GLYPH( source )->library->memory;


    if ( svg_source->format != FT_GLYPH_FORMAT_SVG )
    {
      error = FT_THROW( Invalid_Glyph_Format );
      goto Exit;
    }

    if ( source->svg_document_length == 0 )
    {
      error = FT_THROW( Invalid_Slot_Handle );
      goto Exit;
    }

    target->glyph_index = source->glyph_index;

    target->svg_document_length = source->svg_document_length;

    target->metrics      = source->metrics;
    target->units_per_EM = source->units_per_EM;

    target->start_glyph_id = source->start_glyph_id;
    target->end_glyph_id   = source->end_glyph_id;

    target->transform = source->transform;
    target->delta     = source->delta;

    /* allocate space for the SVG document */
    if ( FT_QALLOC( target->svg_document, target->svg_document_length ) )
      goto Exit;

    /* copy the document */
    FT_MEM_COPY( target->svg_document,
                 source->svg_document,
                 target->svg_document_length );

  Exit:
    return error;
  }